

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O1

Type __thiscall
Fixpp::FieldRef<Fixpp::TagT<924U,_Fixpp::Type::Int>_>::get
          (FieldRef<Fixpp::TagT<924U,_Fixpp::Type::Int>_> *this)

{
  char cVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  
  pcVar5 = (this->m_view).first;
  cVar1 = *pcVar5;
  cVar2 = pcVar5[cVar1 == '-'];
  if ((byte)(cVar2 - 0x30U) < 10) {
    pcVar5 = pcVar5 + (cVar1 == '-');
    lVar4 = 0;
    do {
      pcVar5 = pcVar5 + 1;
      lVar4 = (ulong)(byte)(cVar2 - 0x30) + lVar4 * 10;
      cVar2 = *pcVar5;
    } while ((byte)(cVar2 - 0x30U) < 10);
  }
  else {
    lVar4 = 0;
  }
  lVar3 = -lVar4;
  if (cVar1 != '-') {
    lVar3 = lVar4;
  }
  return lVar3;
}

Assistant:

Type get() const
        {
            return details::LexicalCast<typename TagT::Type>::cast(m_view.first, m_view.second);
        }